

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMathCommand.cxx
# Opt level: O3

bool __thiscall
cmMathCommand::HandleExprCommand
          (cmMathCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long *plVar7;
  size_type *psVar8;
  long *plVar9;
  bool bVar10;
  char *__format;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string error_1;
  cmExprParserHelper helper;
  char buffer [1024];
  string local_598;
  long *local_578;
  long local_570;
  long local_568;
  long lStack_560;
  string local_558;
  long *local_538 [2];
  long local_528 [2];
  long *local_518;
  long local_510;
  long local_508;
  long lStack_500;
  long *local_4f8;
  long local_4f0;
  long local_4e8;
  long lStack_4e0;
  cmExprParserHelper local_4d8;
  string local_438 [32];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  if ((lVar6 == 3) || (lVar6 == 5)) {
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar1 + 1,"ERROR");
    iVar4 = 0;
    if (0x60 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"sub-command EXPR ","");
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_4d8.InputBufferPos = (size_type)&local_4d8.InputBuffer._M_string_length;
      pcVar3 = pbVar2[3]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4d8,pcVar3,pcVar3 + pbVar2[3]._M_string_length);
      iVar4 = std::__cxx11::string::compare((char *)&local_4d8);
      if (iVar4 == 0) {
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x81) {
          local_578 = &local_568;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_578,local_438[0]._M_dataplus._M_p,
                     local_438[0]._M_dataplus._M_p + local_438[0]._M_string_length);
          std::__cxx11::string::append((char *)&local_578);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_578,local_4d8.InputBufferPos);
          psVar8 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_558.field_2._M_allocated_capacity = *psVar8;
            local_558.field_2._8_8_ = plVar7[3];
            local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
          }
          else {
            local_558.field_2._M_allocated_capacity = *psVar8;
            local_558._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_558._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_558);
          local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
          psVar8 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_598.field_2._M_allocated_capacity = *psVar8;
            local_598.field_2._8_8_ = plVar7[3];
          }
          else {
            local_598.field_2._M_allocated_capacity = *psVar8;
            local_598._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_598._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_558._M_dataplus._M_p != &local_558.field_2) {
            operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
          }
          if (local_578 != &local_568) {
            operator_delete(local_578,local_568 + 1);
          }
          cmCommand::SetError(&this->super_cmCommand,&local_598);
          goto LAB_002124f9;
        }
        local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
        pcVar3 = pbVar2[4]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_598,pcVar3,pcVar3 + pbVar2[4]._M_string_length);
        iVar4 = std::__cxx11::string::compare((char *)&local_598);
        bVar10 = true;
        if (iVar4 == 0) {
          iVar4 = 1;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_598);
          if (iVar4 == 0) {
            iVar4 = 2;
          }
          else {
            local_538[0] = local_528;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_538,local_438[0]._M_dataplus._M_p,
                       local_438[0]._M_dataplus._M_p + local_438[0]._M_string_length);
            std::__cxx11::string::append((char *)local_538);
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_538,(ulong)local_598._M_dataplus._M_p);
            local_518 = &local_508;
            plVar9 = plVar7 + 2;
            if ((long *)*plVar7 == plVar9) {
              local_508 = *plVar9;
              lStack_500 = plVar7[3];
            }
            else {
              local_508 = *plVar9;
              local_518 = (long *)*plVar7;
            }
            local_510 = plVar7[1];
            *plVar7 = (long)plVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_518);
            local_4f8 = &local_4e8;
            plVar9 = plVar7 + 2;
            if ((long *)*plVar7 == plVar9) {
              local_4e8 = *plVar9;
              lStack_4e0 = plVar7[3];
            }
            else {
              local_4e8 = *plVar9;
              local_4f8 = (long *)*plVar7;
            }
            local_4f0 = plVar7[1];
            *plVar7 = (long)plVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_4f8,local_4d8.InputBufferPos);
            plVar9 = plVar7 + 2;
            if ((long *)*plVar7 == plVar9) {
              local_568 = *plVar9;
              lStack_560 = plVar7[3];
              local_578 = &local_568;
            }
            else {
              local_568 = *plVar9;
              local_578 = (long *)*plVar7;
            }
            local_570 = plVar7[1];
            *plVar7 = (long)plVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_578);
            psVar8 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_558.field_2._M_allocated_capacity = *psVar8;
              local_558.field_2._8_8_ = plVar7[3];
              local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
            }
            else {
              local_558.field_2._M_allocated_capacity = *psVar8;
              local_558._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_558._M_string_length = plVar7[1];
            *plVar7 = (long)psVar8;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if (local_578 != &local_568) {
              operator_delete(local_578,local_568 + 1);
            }
            if (local_4f8 != &local_4e8) {
              operator_delete(local_4f8,local_4e8 + 1);
            }
            if (local_518 != &local_508) {
              operator_delete(local_518,local_508 + 1);
            }
            if (local_538[0] != local_528) {
              operator_delete(local_538[0],local_528[0] + 1);
            }
            cmCommand::SetError(&this->super_cmCommand,&local_558);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_558._M_dataplus._M_p != &local_558.field_2) {
              operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1
                             );
            }
            iVar4 = 0;
            bVar10 = false;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_578 = &local_568;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_578,local_438[0]._M_dataplus._M_p,
                   local_438[0]._M_dataplus._M_p + local_438[0]._M_string_length);
        std::__cxx11::string::append((char *)&local_578);
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_578,local_4d8.InputBufferPos);
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_558.field_2._M_allocated_capacity = *psVar8;
          local_558.field_2._8_8_ = plVar7[3];
          local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
        }
        else {
          local_558.field_2._M_allocated_capacity = *psVar8;
          local_558._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_558._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_558);
        local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_598.field_2._M_allocated_capacity = *psVar8;
          local_598.field_2._8_8_ = plVar7[3];
        }
        else {
          local_598.field_2._M_allocated_capacity = *psVar8;
          local_598._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_598._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._M_dataplus._M_p != &local_558.field_2) {
          operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
        }
        if (local_578 != &local_568) {
          operator_delete(local_578,local_568 + 1);
        }
        cmCommand::SetError(&this->super_cmCommand,&local_598);
LAB_002124f9:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
        }
        iVar4 = 0;
        bVar10 = false;
      }
      if ((size_type *)local_4d8.InputBufferPos != &local_4d8.InputBuffer._M_string_length) {
        operator_delete((void *)local_4d8.InputBufferPos,local_4d8.InputBuffer._M_string_length + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
        operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar10) goto LAB_002125e7;
    }
    cmExprParserHelper::cmExprParserHelper(&local_4d8);
    iVar5 = cmExprParserHelper::ParseString(&local_4d8,pbVar1[2]._M_dataplus._M_p,0);
    bVar10 = iVar5 != 0;
    if (iVar5 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_438,local_4d8.ErrorString._M_dataplus._M_p,
                 (allocator<char> *)&local_598);
      cmCommand::SetError(&this->super_cmCommand,local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
        operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    else {
      __format = "%ld";
      if (iVar4 == 2) {
        __format = "0x%lx";
      }
      sprintf((char *)local_438,__format,local_4d8.Result);
      if (local_4d8.WarningString._M_string_length != 0) {
        cmMakefile::IssueMessage
                  ((this->super_cmCommand).Makefile,AUTHOR_WARNING,&local_4d8.WarningString);
      }
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar1 + 1,(char *)local_438);
    }
    cmExprParserHelper::~cmExprParserHelper(&local_4d8);
  }
  else {
    local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438,"EXPR called with incorrect arguments.","");
    cmCommand::SetError(&this->super_cmCommand,local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
      operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
    }
LAB_002125e7:
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool cmMathCommand::HandleExprCommand(std::vector<std::string> const& args)
{
  if ((args.size() != 3) && (args.size() != 5)) {
    this->SetError("EXPR called with incorrect arguments.");
    return false;
  }

  enum class NumericFormat
  {
    UNINITIALIZED,
    DECIMAL,
    HEXADECIMAL,
  };

  const std::string& outputVariable = args[1];
  const std::string& expression = args[2];
  size_t argumentIndex = 3;
  NumericFormat outputFormat = NumericFormat::UNINITIALIZED;

  this->Makefile->AddDefinition(outputVariable, "ERROR");

  if (argumentIndex < args.size()) {
    const std::string messageHint = "sub-command EXPR ";
    const std::string option = args[argumentIndex++];
    if (option == "OUTPUT_FORMAT") {
      if (argumentIndex < args.size()) {
        const std::string argument = args[argumentIndex++];
        if (argument == "DECIMAL") {
          outputFormat = NumericFormat::DECIMAL;
        } else if (argument == "HEXADECIMAL") {
          outputFormat = NumericFormat::HEXADECIMAL;
        } else {
          std::string error = messageHint + "value \"" + argument +
            "\" for option \"" + option + "\" is invalid.";
          this->SetError(error);
          return false;
        }
      } else {
        std::string error =
          messageHint + "missing argument for option \"" + option + "\".";
        this->SetError(error);
        return false;
      }
    } else {
      std::string error =
        messageHint + "option \"" + option + "\" is unknown.";
      this->SetError(error);
      return false;
    }
  }

  if (outputFormat == NumericFormat::UNINITIALIZED) {
    outputFormat = NumericFormat::DECIMAL;
  }

  cmExprParserHelper helper;
  if (!helper.ParseString(expression.c_str(), 0)) {
    this->SetError(helper.GetError());
    return false;
  }

  char buffer[1024];
  const char* fmt;
  switch (outputFormat) {
    case NumericFormat::HEXADECIMAL:
      fmt = "0x%" KWIML_INT_PRIx64;
      break;
    case NumericFormat::DECIMAL:
      CM_FALLTHROUGH;
    default:
      fmt = "%" KWIML_INT_PRId64;
      break;
  }
  sprintf(buffer, fmt, helper.GetResult());

  std::string const& w = helper.GetWarning();
  if (!w.empty()) {
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w);
  }

  this->Makefile->AddDefinition(outputVariable, buffer);
  return true;
}